

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O3

void parse_ctl_line(char *line,char **path,uint32 *sf,uint32 *ef,char **id)

{
  char *pcVar1;
  char sv_line [4192];
  char acStack_1078 [4200];
  
  strcpy(acStack_1078,line);
  pcVar1 = strchr(acStack_1078,0x20);
  if (pcVar1 == (char *)0x0) {
    next_ctl_path = strdup(acStack_1078);
    next_ctl_sf = 0xffffffff;
    next_ctl_ef = 0xffffffff;
  }
  else {
    *pcVar1 = '\0';
    next_ctl_path = strdup(acStack_1078);
    next_ctl_sf = atoi(pcVar1 + 1);
    pcVar1 = strchr(pcVar1 + 1,0x20);
    if (pcVar1 == (char *)0x0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
              ,0x103,"Control file line must be \'<path> [<sf> <ef> [<id>]]\', instead saw \'%s\'\n"
              ,line);
      exit(1);
    }
    next_ctl_ef = atoi(pcVar1 + 1);
    pcVar1 = strchr(pcVar1 + 1,0x20);
    if (pcVar1 != (char *)0x0) {
      next_ctl_utt_id = strdup(pcVar1 + 1);
      return;
    }
  }
  next_ctl_utt_id = (char *)0x0;
  return;
}

Assistant:

static void
parse_ctl_line(char *line,
	       char **path,
	       uint32 *sf,
	       uint32 *ef,
	       char **id)
{
    char *sp;
    char sv_line[4192];

    strcpy(sv_line, line);

    sp = strchr(sv_line, ' ');
    if (sp == NULL) {
	/* 'old' style control file */
	if (path)
	    *path = strdup(sv_line);
	if (sf)
	    *sf = NO_FRAME;
	if (ef)
	    *ef = NO_FRAME;
	if (id)
	    *id = NULL;
    }
    else {
	*sp = '\0';
	if (path)
	    *path = strdup(sv_line);
	
	/* at least one space, so try to parse rest of line */
	if (sf != NULL)
	    *sf = atoi(sp+1);	/* set the start frame */

	sp = strchr(sp+1, ' ');
	if (sp == NULL) {
	    E_FATAL("Control file line must be '<path> [<sf> <ef> [<id>]]', instead saw '%s'\n",
		    line);
	}

	if (ef != NULL)
	    *ef = atoi(sp+1);	/* set the end frame */

	sp = strchr(sp+1, ' ');
	if (id != NULL) {
	    if (sp == NULL) {
		/* assume that the optional ID has been omitted */
		*id = NULL;
	    }
	    else {
		*id = strdup(sp+1);	/* set the utterance ID */
	    }
	}
    }
}